

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxInByHandle(void *handle,void *tx_data_handle,uint32_t index,char **txid,uint32_t *vout,
                      uint32_t *sequence,char **script_sig)

{
  pointer pcVar1;
  ConfidentialTransaction *this;
  CfdException *this_00;
  char *work_script_sig;
  char *work_txid;
  Txid temp_txid;
  Script temp_unlocking_script;
  TxInReference ref;
  bool local_239;
  void *local_238;
  char *local_230;
  char *local_228;
  Script local_220;
  Txid local_1e8;
  Script local_1c8;
  undefined1 local_190 [40];
  uint32_t local_168;
  Script local_160;
  uint32_t local_128;
  
  local_228 = (char *)0x0;
  local_230 = (char *)0x0;
  local_238 = handle;
  cfd::Initialize();
  pcVar1 = local_190 + 0x10;
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)local_190);
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  local_239 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_239);
  cfd::core::Txid::Txid(&local_1e8);
  cfd::core::Script::Script(&local_1c8);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (local_239 == true) {
      cfd::core::Transaction::GetTxIn((TxInReference *)local_190,(Transaction *)this,index);
      cfd::core::Txid::Txid((Txid *)&local_220,(Txid *)(local_190 + 8));
      cfd::core::Txid::operator=(&local_1e8,(Txid *)&local_220);
      local_220._vptr_Script = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_220.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_220.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_220.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cfd::core::Script::Script(&local_220,&local_160);
      cfd::core::Script::operator=(&local_1c8,&local_220);
      cfd::core::Script::~Script(&local_220);
      if (vout != (uint32_t *)0x0) {
        *vout = local_168;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = local_128;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_190);
    }
    else {
      cfd::core::ConfidentialTransaction::GetTxIn((ConfidentialTxInReference *)local_190,this,index)
      ;
      cfd::core::Txid::Txid((Txid *)&local_220,(Txid *)(local_190 + 8));
      cfd::core::Txid::operator=(&local_1e8,(Txid *)&local_220);
      local_220._vptr_Script = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_220.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_220.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_220.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cfd::core::Script::Script(&local_220,&local_160);
      cfd::core::Script::operator=(&local_1c8,&local_220);
      cfd::core::Script::~Script(&local_220);
      if (vout != (uint32_t *)0x0) {
        *vout = local_168;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = local_128;
      }
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_190);
    }
    if (txid != (char **)0x0) {
      cfd::core::Txid::GetHex_abi_cxx11_((string *)local_190,&local_1e8);
      local_228 = cfd::capi::CreateString((string *)local_190);
      if ((pointer)local_190._0_8_ != pcVar1) {
        operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      }
    }
    if (script_sig != (char **)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_190,&local_1c8);
      local_230 = cfd::capi::CreateString((string *)local_190);
      if ((pointer)local_190._0_8_ != pcVar1) {
        operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      }
    }
    if (local_228 != (char *)0x0) {
      *txid = local_228;
    }
    if (local_230 != (char *)0x0) {
      *script_sig = local_230;
    }
    cfd::core::Script::~Script(&local_1c8);
    local_1e8._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
    if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_190);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** txid,
    uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}